

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cpp
# Opt level: O0

int __thiscall libDAI::MF::init(MF *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined7 extraout_var;
  string *unaff_retaddr;
  size_t in_stack_00000008;
  Exception *in_stack_00000010;
  iterator qi;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_ffffffffffffff88;
  TFactor<double> *in_stack_ffffffffffffff90;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  *in_stack_ffffffffffffff98;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  uVar2 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((uVar2 & 1) == 0) {
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (allocator<char> *)CONCAT44(in_stack_ffffffffffffffc4,uVar4));
    Exception::Exception(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  local_48._M_current =
       (TFactor<double> *)
       std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                 (in_stack_ffffffffffffff88);
  while( true ) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
              (in_stack_ffffffffffffff88);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_48);
    TFactor<double>::fill(in_stack_ffffffffffffff90,(double)in_stack_ffffffffffffff88);
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator++(in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  }
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void MF::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator qi = _beliefs.begin(); qi != _beliefs.end(); qi++ )
            qi->fill(1.0);
    }